

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathRect
          (ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,ImDrawCornerFlags rounding_corners)

{
  uint uVar1;
  ImVector<ImVec2> *this_00;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVec2 local_58;
  float local_50;
  float local_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar1 = ~rounding_corners;
  fVar3 = 0.5;
  if ((uVar1 & 0xc) != 0) {
    fVar3 = 1.0;
  }
  fVar5 = 0.5;
  if ((uVar1 & 3) != 0) {
    fVar5 = fVar3;
  }
  fVar3 = 0.5;
  if ((uVar1 & 10) != 0) {
    fVar3 = 1.0;
  }
  fVar2 = 0.5;
  if ((uVar1 & 5) != 0) {
    fVar2 = fVar3;
  }
  if (rounding_corners != 0) {
    fVar3 = (*a).x;
    fVar4 = (*a).y;
    fVar5 = ABS(b->x - fVar3) * fVar5 + -1.0;
    if (fVar5 <= rounding) {
      rounding = fVar5;
    }
    fVar5 = ABS(b->y - fVar4) * fVar2 + -1.0;
    if (fVar5 <= rounding) {
      rounding = fVar5;
    }
    if (0.0 < rounding) {
      fVar5 = 0.0;
      if ((rounding_corners & 1U) != 0) {
        fVar5 = rounding;
      }
      local_4c = 0.0;
      if ((rounding_corners & 2U) != 0) {
        local_4c = rounding;
      }
      local_48 = 0.0;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      if ((rounding_corners & 8U) != 0) {
        local_48 = rounding;
        uStack_44 = in_XMM0_Db;
        uStack_40 = in_XMM0_Dc;
        uStack_3c = in_XMM0_Dd;
      }
      local_50 = 0.0;
      if ((rounding_corners & 4U) != 0) {
        local_50 = rounding;
      }
      local_58.x = fVar3 + fVar5;
      local_58.y = fVar4 + fVar5;
      PathArcToFast(this,&local_58,fVar5,6,9);
      local_58.y = a->y + local_4c;
      local_58.x = b->x - local_4c;
      PathArcToFast(this,&local_58,local_4c,9,0xc);
      local_58.x = (*b).x - local_48;
      local_58.y = (*b).y - local_48;
      PathArcToFast(this,&local_58,local_48,0,3);
      local_58.y = b->y - local_50;
      local_58.x = a->x + local_50;
      PathArcToFast(this,&local_58,local_50,3,6);
      return;
    }
  }
  this_00 = &this->_Path;
  ImVector<ImVec2>::push_back(this_00,a);
  local_58.y = a->y;
  local_58.x = b->x;
  ImVector<ImVec2>::push_back(this_00,&local_58);
  ImVector<ImVec2>::push_back(this_00,b);
  local_58.y = b->y;
  local_58.x = a->x;
  ImVector<ImVec2>::push_back(this_00,&local_58);
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, ImDrawCornerFlags rounding_corners)
{
    rounding = ImMin(rounding, ImFabs(b.x - a.x) * ( ((rounding_corners & ImDrawCornerFlags_Top)  == ImDrawCornerFlags_Top)  || ((rounding_corners & ImDrawCornerFlags_Bot)   == ImDrawCornerFlags_Bot)   ? 0.5f : 1.0f ) - 1.0f);
    rounding = ImMin(rounding, ImFabs(b.y - a.y) * ( ((rounding_corners & ImDrawCornerFlags_Left) == ImDrawCornerFlags_Left) || ((rounding_corners & ImDrawCornerFlags_Right) == ImDrawCornerFlags_Right) ? 0.5f : 1.0f ) - 1.0f);

    if (rounding <= 0.0f || rounding_corners == 0)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x, a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x, b.y));
    }
    else
    {
        const float rounding_tl = (rounding_corners & ImDrawCornerFlags_TopLeft) ? rounding : 0.0f;
        const float rounding_tr = (rounding_corners & ImDrawCornerFlags_TopRight) ? rounding : 0.0f;
        const float rounding_br = (rounding_corners & ImDrawCornerFlags_BotRight) ? rounding : 0.0f;
        const float rounding_bl = (rounding_corners & ImDrawCornerFlags_BotLeft) ? rounding : 0.0f;
        PathArcToFast(ImVec2(a.x + rounding_tl, a.y + rounding_tl), rounding_tl, 6, 9);
        PathArcToFast(ImVec2(b.x - rounding_tr, a.y + rounding_tr), rounding_tr, 9, 12);
        PathArcToFast(ImVec2(b.x - rounding_br, b.y - rounding_br), rounding_br, 0, 3);
        PathArcToFast(ImVec2(a.x + rounding_bl, b.y - rounding_bl), rounding_bl, 3, 6);
    }
}